

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::Connection::Connection(Connection *this,CodeLocation *l)

{
  CodeLocation local_28;
  CodeLocation *local_18;
  CodeLocation *l_local;
  Connection *this_local;
  
  local_18 = l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_28,l);
  Object::Object(&this->super_Object,&local_28);
  CodeLocation::~CodeLocation(&local_28);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Connection_0058b5c0;
  EndpointReference::EndpointReference(&this->source);
  EndpointReference::EndpointReference(&this->dest);
  this->interpolationType = none;
  std::optional<long>::optional(&this->delayLength);
  return;
}

Assistant:

Connection (CodeLocation l) : Object (std::move (l)) {}